

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  bool bVar1;
  string *psVar2;
  char *filename;
  ostream *poVar3;
  string local_230;
  undefined1 local_210 [8];
  ostringstream msg;
  cmListFileContext local_88;
  string local_40 [8];
  string path;
  string *name_local;
  char *reason_local;
  cmMakefile *this_local;
  
  if ((this->WarnUnused & 1U) == 0) {
    return;
  }
  path.field_2._8_8_ = name;
  std::__cxx11::string::string(local_40);
  bVar1 = std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::empty
                    (&this->ExecutionStatusStack);
  if (bVar1) {
    psVar2 = GetCurrentSourceDirectory_abi_cxx11_(this);
    std::__cxx11::string::operator=(local_40,(string *)psVar2);
    std::__cxx11::string::operator+=(local_40,"/CMakeLists.txt");
  }
  else {
    GetExecutionContext(&local_88,this);
    std::__cxx11::string::operator=(local_40,(string *)&local_88.FilePath);
    cmListFileContext::~cmListFileContext(&local_88);
  }
  if ((this->CheckSystemVars & 1U) == 0) {
    filename = (char *)std::__cxx11::string::c_str();
    bVar1 = IsProjectFile(this,filename);
    if (!bVar1) goto LAB_001eaf41;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
  poVar3 = std::operator<<((ostream *)local_210,"unused variable (");
  poVar3 = std::operator<<(poVar3,reason);
  poVar3 = std::operator<<(poVar3,") \'");
  poVar3 = std::operator<<(poVar3,(string *)path.field_2._8_8_);
  std::operator<<(poVar3,"\'");
  std::__cxx11::ostringstream::str();
  IssueMessage(this,AUTHOR_WARNING,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
LAB_001eaf41:
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason, const std::string& name) const
{
  if (this->WarnUnused) {
    std::string path;
    if (!this->ExecutionStatusStack.empty()) {
      path = this->GetExecutionContext().FilePath;
    } else {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
    }

    if (this->CheckSystemVars || this->IsProjectFile(path.c_str())) {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->IssueMessage(MessageType::AUTHOR_WARNING, msg.str());
    }
  }
}